

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnumMethods.cpp
# Opt level: O2

void __thiscall slang::ast::builtins::EnumNameMethod::~EnumNameMethod(EnumNameMethod *this)

{
  SimpleSystemSubroutine::~SimpleSystemSubroutine(&this->super_SimpleSystemSubroutine);
  operator_delete(this,0x68);
  return;
}

Assistant:

explicit EnumNameMethod(const Builtins& builtins) :
        SimpleSystemSubroutine(KnownSystemName::Name, SubroutineKind::Function, 0, {},
                               builtins.stringType, true) {}